

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx.cpp
# Opt level: O1

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *weight_hr,Mat *hidden_state,Mat *cell_state,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint _h;
  void *pvVar8;
  size_t sVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  long lVar15;
  void *pvVar16;
  ulong uVar17;
  uint uVar18;
  float *pfVar19;
  ulong uVar20;
  float *pfVar21;
  int iVar22;
  long lVar23;
  void *pvVar24;
  long lVar25;
  float *pfVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar34 [32];
  undefined1 auVar36 [64];
  float fVar44;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar62 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined4 uVar112;
  undefined1 in_ZMM12 [64];
  undefined1 auVar113 [16];
  Mat local_1b8;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  Mat *local_148;
  Mat *local_140;
  Mat *local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  undefined1 local_118 [32];
  Allocator *local_f8;
  int iStack_f0;
  int iStack_ec;
  undefined8 uStack_e8;
  int local_e0;
  size_t local_d8;
  undefined1 local_c8 [16];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ulong local_a0;
  long local_98;
  ulong local_90;
  Mat *local_88;
  Mat *local_80;
  ulong local_78;
  long local_70;
  void *local_68;
  void *local_60;
  undefined1 local_58 [32];
  undefined1 auVar35 [32];
  
  uVar5 = bottom_blob->w;
  uVar6 = bottom_blob->h;
  uVar7 = top_blob->w;
  _h = cell_state->w;
  local_1b8.cstep = 0;
  local_1b8.data = (void *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize = 0;
  local_1b8.elempack = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  local_140 = bottom_blob;
  local_138 = weight_xc;
  local_80 = top_blob;
  Mat::create(&local_1b8,4,_h,4,opt->workspace_allocator);
  iVar22 = -100;
  if ((local_1b8.data == (void *)0x0) || ((long)local_1b8.c * local_1b8.cstep == 0))
  goto LAB_003a8489;
  uVar14 = (ulong)(int)_h;
  local_d8 = 0;
  local_118._0_8_ = (void *)0x0;
  local_118._8_4_ = 0;
  local_118._12_4_ = 0;
  local_118._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_f8 = (Allocator *)0x0;
  iStack_f0 = 0;
  iStack_ec = 0;
  uStack_e8._0_4_ = 0;
  uStack_e8._4_4_ = 0;
  local_e0 = 0;
  local_148 = bias_c;
  if (uVar7 == _h) {
LAB_003a77de:
    if ((int)uVar6 < 1) {
      iVar22 = 0;
    }
    else {
      local_120 = (ulong)(uint)((int)_h >> 1);
      local_128 = uVar14 & 0xfffffffffffffffe;
      local_90 = (ulong)(uint)((int)_h >> 2);
      local_130 = uVar14 & 0xfffffffffffffffc;
      local_a0 = (ulong)(_h + 7 & 0xfffffff8);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = (ulong)_h - 1;
      auVar82 = vpshufd_avx(auVar82,0x44);
      local_58._16_16_ = auVar82;
      local_58._0_16_ = auVar82;
      local_98 = local_90 * 4;
      uVar20 = 0;
      local_88 = weight_hc;
      do {
        uVar18 = ~(uint)uVar20 + uVar6;
        if (reverse == 0) {
          uVar18 = (uint)uVar20;
        }
        lVar15 = (long)(int)uVar18;
        if (0 < (int)local_120) {
          uVar17 = 0;
          do {
            pfVar19 = (float *)((long)local_138->w * uVar17 * local_138->elemsize +
                               (long)local_138->data);
            pfVar21 = (float *)(local_140->w * lVar15 * local_140->elemsize + (long)local_140->data)
            ;
            pfVar26 = (float *)((long)local_148->data + uVar17 * 0x20);
            fVar27 = *pfVar26;
            fVar37 = pfVar26[1];
            fVar38 = pfVar26[2];
            fVar39 = pfVar26[3];
            fVar40 = pfVar26[4];
            fVar41 = pfVar26[5];
            fVar42 = pfVar26[6];
            fVar43 = pfVar26[7];
            if ((int)uVar5 < 4) {
              fVar59 = 0.0;
              fVar63 = 0.0;
              fVar64 = 0.0;
              fVar65 = 0.0;
              fVar66 = 0.0;
              fVar67 = 0.0;
              fVar68 = 0.0;
              fVar69 = 0.0;
              auVar79 = ZEXT864(0);
              fVar44 = 0.0;
              fVar52 = 0.0;
              fVar53 = 0.0;
              fVar54 = 0.0;
              fVar55 = 0.0;
              fVar56 = 0.0;
              fVar57 = 0.0;
              fVar58 = 0.0;
              uVar18 = 0;
            }
            else {
              fVar44 = 0.0;
              fVar52 = 0.0;
              fVar53 = 0.0;
              fVar54 = 0.0;
              fVar55 = 0.0;
              fVar56 = 0.0;
              fVar57 = 0.0;
              fVar58 = 0.0;
              iVar22 = 3;
              auVar79 = ZEXT864(0);
              fVar59 = 0.0;
              fVar63 = 0.0;
              fVar64 = 0.0;
              fVar65 = 0.0;
              fVar66 = 0.0;
              fVar67 = 0.0;
              fVar68 = 0.0;
              fVar69 = 0.0;
              do {
                fVar1 = *pfVar21;
                fVar2 = pfVar21[1];
                fVar3 = pfVar21[2];
                fVar4 = pfVar21[3];
                fVar27 = fVar1 * *pfVar19 + fVar27;
                fVar37 = fVar1 * pfVar19[1] + fVar37;
                fVar38 = fVar1 * pfVar19[2] + fVar38;
                fVar39 = fVar1 * pfVar19[3] + fVar39;
                fVar40 = fVar1 * pfVar19[4] + fVar40;
                fVar41 = fVar1 * pfVar19[5] + fVar41;
                fVar42 = fVar1 * pfVar19[6] + fVar42;
                fVar43 = fVar1 + fVar43;
                fVar44 = fVar2 * pfVar19[8] + fVar44;
                fVar52 = fVar2 * pfVar19[9] + fVar52;
                fVar53 = fVar2 * pfVar19[10] + fVar53;
                fVar54 = fVar2 * pfVar19[0xb] + fVar54;
                fVar55 = fVar2 * pfVar19[0xc] + fVar55;
                fVar56 = fVar2 * pfVar19[0xd] + fVar56;
                fVar57 = fVar2 * pfVar19[0xe] + fVar57;
                fVar58 = fVar2 + fVar58;
                auVar79 = ZEXT3264(CONCAT428(fVar1 + auVar79._28_4_,
                                             CONCAT424(fVar3 * pfVar19[0x16] + auVar79._24_4_,
                                                       CONCAT420(fVar3 * pfVar19[0x15] +
                                                                 auVar79._20_4_,
                                                                 CONCAT416(fVar3 * pfVar19[0x14] +
                                                                           auVar79._16_4_,
                                                                           CONCAT412(fVar3 * pfVar19
                                                  [0x13] + auVar79._12_4_,
                                                  CONCAT48(fVar3 * pfVar19[0x12] + auVar79._8_4_,
                                                           CONCAT44(fVar3 * pfVar19[0x11] +
                                                                    auVar79._4_4_,
                                                                    fVar3 * pfVar19[0x10] +
                                                                    auVar79._0_4_))))))));
                fVar59 = fVar4 * pfVar19[0x18] + fVar59;
                fVar63 = fVar4 * pfVar19[0x19] + fVar63;
                fVar64 = fVar4 * pfVar19[0x1a] + fVar64;
                fVar65 = fVar4 * pfVar19[0x1b] + fVar65;
                fVar66 = fVar4 * pfVar19[0x1c] + fVar66;
                fVar67 = fVar4 * pfVar19[0x1d] + fVar67;
                fVar68 = fVar4 * pfVar19[0x1e] + fVar68;
                fVar69 = fVar1 + fVar69;
                pfVar21 = pfVar21 + 4;
                pfVar19 = pfVar19 + 0x20;
                iVar22 = iVar22 + 4;
                uVar18 = uVar5 & 0xfffffffc;
              } while (iVar22 < (int)uVar5);
            }
            auVar78 = auVar79._0_32_;
            if ((int)uVar18 < (int)uVar5) {
              lVar23 = 0;
              do {
                fVar1 = pfVar21[lVar23];
                fVar27 = fVar1 * *pfVar19 + fVar27;
                fVar37 = fVar1 * pfVar19[1] + fVar37;
                fVar38 = fVar1 * pfVar19[2] + fVar38;
                fVar39 = fVar1 * pfVar19[3] + fVar39;
                fVar40 = fVar1 * pfVar19[4] + fVar40;
                fVar41 = fVar1 * pfVar19[5] + fVar41;
                fVar42 = fVar1 * pfVar19[6] + fVar42;
                fVar43 = fVar1 + fVar43;
                pfVar19 = pfVar19 + 8;
                lVar23 = lVar23 + 1;
              } while (uVar5 - uVar18 != (int)lVar23);
            }
            pfVar19 = (float *)((long)local_88->w * uVar17 * local_88->elemsize +
                               (long)local_88->data);
            pfVar26 = (float *)hidden_state->data;
            uVar18 = 0;
            if (3 < (int)uVar7) {
              iVar22 = 3;
              do {
                fVar1 = *pfVar26;
                fVar2 = pfVar26[1];
                fVar3 = pfVar26[2];
                fVar4 = pfVar26[3];
                fVar27 = fVar1 * *pfVar19 + fVar27;
                fVar37 = fVar1 * pfVar19[1] + fVar37;
                fVar38 = fVar1 * pfVar19[2] + fVar38;
                fVar39 = fVar1 * pfVar19[3] + fVar39;
                fVar40 = fVar1 * pfVar19[4] + fVar40;
                fVar41 = fVar1 * pfVar19[5] + fVar41;
                fVar42 = fVar1 * pfVar19[6] + fVar42;
                fVar43 = fVar1 + fVar43;
                fVar44 = fVar2 * pfVar19[8] + fVar44;
                fVar52 = fVar2 * pfVar19[9] + fVar52;
                fVar53 = fVar2 * pfVar19[10] + fVar53;
                fVar54 = fVar2 * pfVar19[0xb] + fVar54;
                fVar55 = fVar2 * pfVar19[0xc] + fVar55;
                fVar56 = fVar2 * pfVar19[0xd] + fVar56;
                fVar57 = fVar2 * pfVar19[0xe] + fVar57;
                fVar58 = fVar2 + fVar58;
                auVar78._0_4_ = fVar3 * pfVar19[0x10] + auVar79._0_4_;
                auVar78._4_4_ = fVar3 * pfVar19[0x11] + auVar79._4_4_;
                auVar78._8_4_ = fVar3 * pfVar19[0x12] + auVar79._8_4_;
                auVar78._12_4_ = fVar3 * pfVar19[0x13] + auVar79._12_4_;
                auVar78._16_4_ = fVar3 * pfVar19[0x14] + auVar79._16_4_;
                auVar78._20_4_ = fVar3 * pfVar19[0x15] + auVar79._20_4_;
                auVar78._24_4_ = fVar3 * pfVar19[0x16] + auVar79._24_4_;
                auVar78._28_4_ = fVar1 + auVar79._28_4_;
                auVar79 = ZEXT3264(auVar78);
                fVar59 = fVar4 * pfVar19[0x18] + fVar59;
                fVar63 = fVar4 * pfVar19[0x19] + fVar63;
                fVar64 = fVar4 * pfVar19[0x1a] + fVar64;
                fVar65 = fVar4 * pfVar19[0x1b] + fVar65;
                fVar66 = fVar4 * pfVar19[0x1c] + fVar66;
                fVar67 = fVar4 * pfVar19[0x1d] + fVar67;
                fVar68 = fVar4 * pfVar19[0x1e] + fVar68;
                fVar69 = fVar1 + fVar69;
                pfVar26 = pfVar26 + 4;
                pfVar19 = pfVar19 + 0x20;
                iVar22 = iVar22 + 4;
                uVar18 = uVar7 & 0xfffffffc;
              } while (iVar22 < (int)uVar7);
            }
            if ((int)uVar18 < (int)uVar7) {
              lVar23 = 0;
              do {
                fVar1 = pfVar26[lVar23];
                fVar27 = fVar1 * *pfVar19 + fVar27;
                fVar37 = fVar1 * pfVar19[1] + fVar37;
                fVar38 = fVar1 * pfVar19[2] + fVar38;
                fVar39 = fVar1 * pfVar19[3] + fVar39;
                fVar40 = fVar1 * pfVar19[4] + fVar40;
                fVar41 = fVar1 * pfVar19[5] + fVar41;
                fVar42 = fVar1 * pfVar19[6] + fVar42;
                fVar43 = fVar1 + fVar43;
                pfVar19 = pfVar19 + 8;
                lVar23 = lVar23 + 1;
              } while (uVar7 - uVar18 != (int)lVar23);
            }
            auVar34._0_4_ = auVar78._0_4_ + fVar59 + fVar44 + fVar27;
            auVar34._4_4_ = auVar78._4_4_ + fVar63 + fVar52 + fVar37;
            auVar34._8_4_ = auVar78._8_4_ + fVar64 + fVar53 + fVar38;
            auVar34._12_4_ = auVar78._12_4_ + fVar65 + fVar54 + fVar39;
            auVar34._16_4_ = auVar78._16_4_ + fVar66 + fVar55 + fVar40;
            auVar34._20_4_ = auVar78._20_4_ + fVar67 + fVar56 + fVar41;
            auVar34._24_4_ = auVar78._24_4_ + fVar68 + fVar57 + fVar42;
            auVar34._28_4_ = auVar78._28_4_ + fVar69 + fVar58 + fVar43;
            *(undefined1 (*) [32])
             ((long)local_1b8.data + (long)local_1b8.w * uVar17 * 2 * local_1b8.elemsize) = auVar34;
            uVar17 = uVar17 + 1;
          } while (uVar17 != local_120);
        }
        uVar17 = local_128;
        if ((uint)local_128 != _h) {
          do {
            uVar18 = ((uint)(uVar17 >> 0x1f) & 1) + (int)uVar17;
            lVar23 = (long)(int)(((int)uVar18 >> 1) + ((int)uVar17 - (uVar18 & 0xfffffffe)));
            pfVar19 = (float *)(local_138->w * lVar23 * local_138->elemsize + (long)local_138->data)
            ;
            pfVar21 = (float *)(local_140->w * lVar15 * local_140->elemsize + (long)local_140->data)
            ;
            pfVar26 = (float *)((long)local_148->data + uVar17 * 0x10);
            fVar27 = *pfVar26;
            fVar37 = pfVar26[1];
            fVar38 = pfVar26[2];
            fVar39 = pfVar26[3];
            if ((int)uVar5 < 4) {
              fVar44 = 0.0;
              fVar52 = 0.0;
              fVar53 = 0.0;
              fVar54 = 0.0;
              auVar79 = ZEXT864(0);
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              uVar18 = 0;
            }
            else {
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              iVar22 = 3;
              auVar79 = ZEXT864(0);
              fVar44 = 0.0;
              fVar52 = 0.0;
              fVar53 = 0.0;
              fVar54 = 0.0;
              do {
                fVar55 = *pfVar21;
                fVar56 = pfVar21[1];
                fVar57 = pfVar21[2];
                fVar58 = pfVar21[3];
                fVar27 = fVar55 * *pfVar19 + fVar27;
                fVar37 = fVar55 * pfVar19[1] + fVar37;
                fVar38 = fVar55 * pfVar19[2] + fVar38;
                fVar39 = fVar55 * pfVar19[3] + fVar39;
                fVar44 = fVar56 * pfVar19[4] + fVar44;
                fVar52 = fVar56 * pfVar19[5] + fVar52;
                fVar53 = fVar56 * pfVar19[6] + fVar53;
                fVar54 = fVar56 * pfVar19[7] + fVar54;
                auVar79 = ZEXT1664(CONCAT412(fVar57 * pfVar19[0xb] + auVar79._12_4_,
                                             CONCAT48(fVar57 * pfVar19[10] + auVar79._8_4_,
                                                      CONCAT44(fVar57 * pfVar19[9] + auVar79._4_4_,
                                                               fVar57 * pfVar19[8] + auVar79._0_4_))
                                            ));
                fVar40 = fVar58 * pfVar19[0xc] + fVar40;
                fVar41 = fVar58 * pfVar19[0xd] + fVar41;
                fVar42 = fVar58 * pfVar19[0xe] + fVar42;
                fVar43 = fVar58 * pfVar19[0xf] + fVar43;
                pfVar21 = pfVar21 + 4;
                pfVar19 = pfVar19 + 0x10;
                iVar22 = iVar22 + 4;
                uVar18 = uVar5 & 0xfffffffc;
              } while (iVar22 < (int)uVar5);
            }
            auVar70 = auVar79._0_16_;
            if ((int)uVar18 < (int)uVar5) {
              lVar25 = 0;
              do {
                fVar55 = pfVar21[lVar25];
                fVar27 = fVar55 * *pfVar19 + fVar27;
                fVar37 = fVar55 * pfVar19[1] + fVar37;
                fVar38 = fVar55 * pfVar19[2] + fVar38;
                fVar39 = fVar55 * pfVar19[3] + fVar39;
                pfVar19 = pfVar19 + 4;
                lVar25 = lVar25 + 1;
              } while (uVar5 - uVar18 != (int)lVar25);
            }
            pfVar19 = (float *)(local_88->w * lVar23 * local_88->elemsize + (long)local_88->data);
            pfVar26 = (float *)hidden_state->data;
            uVar18 = 0;
            if (3 < (int)uVar7) {
              iVar22 = 3;
              do {
                fVar55 = *pfVar26;
                fVar56 = pfVar26[1];
                fVar57 = pfVar26[2];
                fVar58 = pfVar26[3];
                fVar27 = fVar55 * *pfVar19 + fVar27;
                fVar37 = fVar55 * pfVar19[1] + fVar37;
                fVar38 = fVar55 * pfVar19[2] + fVar38;
                fVar39 = fVar55 * pfVar19[3] + fVar39;
                fVar44 = fVar56 * pfVar19[4] + fVar44;
                fVar52 = fVar56 * pfVar19[5] + fVar52;
                fVar53 = fVar56 * pfVar19[6] + fVar53;
                fVar54 = fVar56 * pfVar19[7] + fVar54;
                auVar70._0_4_ = fVar57 * pfVar19[8] + auVar79._0_4_;
                auVar70._4_4_ = fVar57 * pfVar19[9] + auVar79._4_4_;
                auVar70._8_4_ = fVar57 * pfVar19[10] + auVar79._8_4_;
                auVar70._12_4_ = fVar57 * pfVar19[0xb] + auVar79._12_4_;
                auVar79 = ZEXT1664(auVar70);
                fVar40 = fVar58 * pfVar19[0xc] + fVar40;
                fVar41 = fVar58 * pfVar19[0xd] + fVar41;
                fVar42 = fVar58 * pfVar19[0xe] + fVar42;
                fVar43 = fVar58 * pfVar19[0xf] + fVar43;
                pfVar26 = pfVar26 + 4;
                pfVar19 = pfVar19 + 0x10;
                iVar22 = iVar22 + 4;
                uVar18 = uVar7 & 0xfffffffc;
              } while (iVar22 < (int)uVar7);
            }
            if ((int)uVar18 < (int)uVar7) {
              lVar23 = 0;
              do {
                fVar55 = pfVar26[lVar23];
                fVar27 = fVar55 * *pfVar19 + fVar27;
                fVar37 = fVar55 * pfVar19[1] + fVar37;
                fVar38 = fVar55 * pfVar19[2] + fVar38;
                fVar39 = fVar55 * pfVar19[3] + fVar39;
                pfVar19 = pfVar19 + 4;
                lVar23 = lVar23 + 1;
              } while (uVar7 - uVar18 != (int)lVar23);
            }
            auVar28._0_4_ = auVar70._0_4_ + fVar44 + fVar40 + fVar27;
            auVar28._4_4_ = auVar70._4_4_ + fVar52 + fVar41 + fVar37;
            auVar28._8_4_ = auVar70._8_4_ + fVar53 + fVar42 + fVar38;
            auVar28._12_4_ = auVar70._12_4_ + fVar54 + fVar43 + fVar39;
            *(undefined1 (*) [16])
             ((long)local_1b8.data + (long)local_1b8.w * uVar17 * local_1b8.elemsize) = auVar28;
            uVar17 = uVar17 + 1;
          } while ((long)uVar17 < (long)uVar14);
        }
        pvVar24 = (void *)(local_80->w * lVar15 * local_80->elemsize + (long)local_80->data);
        local_68 = cell_state->data;
        pvVar8 = hidden_state->data;
        if (0 < (int)local_90) {
          lVar15 = 0;
          do {
            lVar23 = local_1b8.w * lVar15 * local_1b8.elemsize;
            auVar82 = *(undefined1 (*) [16])((long)local_1b8.data + lVar23 + 0x10);
            auVar70 = *(undefined1 (*) [16])((long)local_1b8.data + lVar23 + 0x20);
            auVar28 = *(undefined1 (*) [16])((long)local_1b8.data + lVar23 + 0x30);
            auVar48 = vunpcklps_avx(*(undefined1 (*) [16])((long)local_1b8.data + lVar23),auVar82);
            auVar29 = vunpcklps_avx(auVar70,auVar28);
            auVar30 = vunpckhps_avx(*(undefined1 (*) [16])((long)local_1b8.data + lVar23),auVar82);
            auVar70 = vunpckhps_avx(auVar70,auVar28);
            auVar82 = vmovlhps_avx(auVar48,auVar29);
            auVar29 = vunpckhpd_avx(auVar48,auVar29);
            auVar48 = vmovlhps_avx(auVar30,auVar70);
            _local_158 = vunpckhpd_avx(auVar30,auVar70);
            auVar45._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
            auVar45._8_4_ = auVar82._8_4_ ^ 0x80000000;
            auVar45._12_4_ = auVar82._12_4_ ^ 0x80000000;
            auVar113._8_4_ = 0x42b0c0a5;
            auVar113._0_8_ = 0x42b0c0a542b0c0a5;
            auVar113._12_4_ = 0x42b0c0a5;
            auVar82 = vminps_avx(auVar113,auVar45);
            auVar109._8_4_ = 0xc2b0c0a5;
            auVar109._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar109._12_4_ = 0xc2b0c0a5;
            auVar28 = vmaxps_avx(auVar109,auVar82);
            auVar80._0_4_ = auVar28._0_4_ * 1.442695 + 0.5;
            auVar80._4_4_ = auVar28._4_4_ * 1.442695 + 0.5;
            auVar80._8_4_ = auVar28._8_4_ * 1.442695 + 0.5;
            auVar80._12_4_ = auVar28._12_4_ * 1.442695 + 0.5;
            auVar93._0_4_ = (int)auVar80._0_4_;
            auVar93._4_4_ = (int)auVar80._4_4_;
            auVar93._8_4_ = (int)auVar80._8_4_;
            auVar93._12_4_ = (int)auVar80._12_4_;
            auVar70 = vcvtdq2ps_avx(auVar93);
            auVar82 = vcmpps_avx(auVar80,auVar70,1);
            auVar110._8_4_ = 0x3f800000;
            auVar110._0_8_ = 0x3f8000003f800000;
            auVar110._12_4_ = 0x3f800000;
            auVar82 = vandps_avx(auVar110,auVar82);
            auVar82 = vsubps_avx(auVar70,auVar82);
            auVar94._0_4_ = auVar82._0_4_ * 0.6931472;
            auVar94._4_4_ = auVar82._4_4_ * 0.6931472;
            auVar94._8_4_ = auVar82._8_4_ * 0.6931472;
            auVar94._12_4_ = auVar82._12_4_ * 0.6931472;
            auVar70 = vsubps_avx(auVar28,auVar94);
            fVar27 = auVar70._0_4_;
            fVar37 = auVar70._4_4_;
            fVar38 = auVar70._8_4_;
            fVar39 = auVar70._12_4_;
            auVar81._0_4_ = (int)auVar82._0_4_;
            auVar81._4_4_ = (int)auVar82._4_4_;
            auVar81._8_4_ = (int)auVar82._8_4_;
            auVar81._12_4_ = (int)auVar82._12_4_;
            auVar82 = vpslld_avx(auVar81,0x17);
            auVar82 = vpaddd_avx(auVar110,auVar82);
            local_b8 = (fVar27 + 1.0 +
                       fVar27 * fVar27 *
                       (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27
                         + 0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar82._0_4_;
            fStack_b4 = (fVar37 + 1.0 +
                        fVar37 * fVar37 *
                        (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37
                          + 0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar82._4_4_;
            fStack_b0 = (fVar38 + 1.0 +
                        fVar38 * fVar38 *
                        (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38
                          + 0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) * auVar82._8_4_;
            fStack_ac = (fVar39 + 1.0 +
                        fVar39 * fVar39 *
                        (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39
                          + 0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar82._12_4_;
            auVar71._0_8_ = auVar29._0_8_ ^ 0x8000000080000000;
            auVar71._8_4_ = auVar29._8_4_ ^ 0x80000000;
            auVar71._12_4_ = auVar29._12_4_ ^ 0x80000000;
            auVar82 = vminps_avx(auVar113,auVar71);
            auVar28 = vmaxps_avx(auVar109,auVar82);
            auVar83._0_4_ = auVar28._0_4_ * 1.442695 + 0.5;
            auVar83._4_4_ = auVar28._4_4_ * 1.442695 + 0.5;
            auVar83._8_4_ = auVar28._8_4_ * 1.442695 + 0.5;
            auVar83._12_4_ = auVar28._12_4_ * 1.442695 + 0.5;
            auVar95._0_4_ = (int)auVar83._0_4_;
            auVar95._4_4_ = (int)auVar83._4_4_;
            auVar95._8_4_ = (int)auVar83._8_4_;
            auVar95._12_4_ = (int)auVar83._12_4_;
            auVar70 = vcvtdq2ps_avx(auVar95);
            auVar82 = vcmpps_avx(auVar83,auVar70,1);
            auVar82 = vandps_avx(auVar110,auVar82);
            auVar82 = vsubps_avx(auVar70,auVar82);
            auVar96._0_4_ = auVar82._0_4_ * 0.6931472;
            auVar96._4_4_ = auVar82._4_4_ * 0.6931472;
            auVar96._8_4_ = auVar82._8_4_ * 0.6931472;
            auVar96._12_4_ = auVar82._12_4_ * 0.6931472;
            auVar70 = vsubps_avx(auVar28,auVar96);
            fVar27 = auVar70._0_4_;
            fVar37 = auVar70._4_4_;
            fVar38 = auVar70._8_4_;
            fVar39 = auVar70._12_4_;
            auVar84._0_4_ = (int)auVar82._0_4_;
            auVar84._4_4_ = (int)auVar82._4_4_;
            auVar84._8_4_ = (int)auVar82._8_4_;
            auVar84._12_4_ = (int)auVar82._12_4_;
            auVar82 = vpslld_avx(auVar84,0x17);
            auVar82 = vpaddd_avx(auVar110,auVar82);
            local_168._0_4_ =
                 (fVar27 + 1.0 +
                 fVar27 * fVar27 *
                 (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                   0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar82._0_4_;
            local_168._4_4_ =
                 (fVar37 + 1.0 +
                 fVar37 * fVar37 *
                 (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37 +
                   0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar82._4_4_;
            fStack_160 = (fVar38 + 1.0 +
                         fVar38 * fVar38 *
                         (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) *
                            fVar38 + 0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) *
                         auVar82._8_4_;
            fStack_15c = (fVar39 + 1.0 +
                         fVar39 * fVar39 *
                         (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) *
                            fVar39 + 0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) *
                         auVar82._12_4_;
            auVar60._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
            auVar60._8_4_ = auVar48._8_4_ ^ 0x80000000;
            auVar60._12_4_ = auVar48._12_4_ ^ 0x80000000;
            auVar82 = vminps_avx(auVar113,auVar60);
            auVar72._8_4_ = 0xc2b0c0a5;
            auVar72._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar72._12_4_ = 0xc2b0c0a5;
            auVar28 = vmaxps_avx(auVar82,auVar72);
            auVar85._0_4_ = auVar28._0_4_ * 1.442695 + 0.5;
            auVar85._4_4_ = auVar28._4_4_ * 1.442695 + 0.5;
            auVar85._8_4_ = auVar28._8_4_ * 1.442695 + 0.5;
            auVar85._12_4_ = auVar28._12_4_ * 1.442695 + 0.5;
            auVar97._0_4_ = (int)auVar85._0_4_;
            auVar97._4_4_ = (int)auVar85._4_4_;
            auVar97._8_4_ = (int)auVar85._8_4_;
            auVar97._12_4_ = (int)auVar85._12_4_;
            auVar70 = vcvtdq2ps_avx(auVar97);
            auVar82 = vcmpps_avx(auVar85,auVar70,1);
            auVar82 = vandps_avx(auVar110,auVar82);
            auVar82 = vsubps_avx(auVar70,auVar82);
            auVar98._0_4_ = auVar82._0_4_ * 0.6931472;
            auVar98._4_4_ = auVar82._4_4_ * 0.6931472;
            auVar98._8_4_ = auVar82._8_4_ * 0.6931472;
            auVar98._12_4_ = auVar82._12_4_ * 0.6931472;
            in_ZMM12 = ZEXT1664(CONCAT412(0x3f317218,CONCAT48(0x3f317218,0x3f3172183f317218)));
            auVar70 = vsubps_avx(auVar28,auVar98);
            fVar27 = auVar70._0_4_;
            fVar38 = auVar70._4_4_;
            fVar40 = auVar70._8_4_;
            fVar42 = auVar70._12_4_;
            auVar86._0_4_ = (int)auVar82._0_4_;
            auVar86._4_4_ = (int)auVar82._4_4_;
            auVar86._8_4_ = (int)auVar82._8_4_;
            auVar86._12_4_ = (int)auVar82._12_4_;
            auVar82 = vpslld_avx(auVar86,0x17);
            auVar48 = vpaddd_avx(auVar110,auVar82);
            auVar29._0_4_ = (float)local_158._0_4_ * -2.0;
            auVar29._4_4_ = (float)local_158._4_4_ * -2.0;
            auVar29._8_4_ = fStack_150 * -2.0;
            auVar29._12_4_ = fStack_14c * -2.0;
            auVar82 = vminps_avx(auVar113,auVar29);
            auVar28 = vmaxps_avx(auVar82,auVar72);
            auVar87._0_4_ = auVar28._0_4_ * 1.442695 + 0.5;
            auVar87._4_4_ = auVar28._4_4_ * 1.442695 + 0.5;
            auVar87._8_4_ = auVar28._8_4_ * 1.442695 + 0.5;
            auVar87._12_4_ = auVar28._12_4_ * 1.442695 + 0.5;
            auVar99._0_4_ = (int)auVar87._0_4_;
            auVar99._4_4_ = (int)auVar87._4_4_;
            auVar99._8_4_ = (int)auVar87._8_4_;
            auVar99._12_4_ = (int)auVar87._12_4_;
            auVar70 = vcvtdq2ps_avx(auVar99);
            auVar82 = vcmpps_avx(auVar87,auVar70,1);
            auVar82 = vandps_avx(auVar110,auVar82);
            auVar82 = vsubps_avx(auVar70,auVar82);
            auVar100._0_4_ = auVar82._0_4_ * 0.6931472;
            auVar100._4_4_ = auVar82._4_4_ * 0.6931472;
            auVar100._8_4_ = auVar82._8_4_ * 0.6931472;
            auVar100._12_4_ = auVar82._12_4_ * 0.6931472;
            auVar70 = vsubps_avx(auVar28,auVar100);
            fVar37 = auVar70._0_4_;
            fVar39 = auVar70._4_4_;
            fVar41 = auVar70._8_4_;
            fVar43 = auVar70._12_4_;
            auVar46._0_4_ = local_b8 + 1.0;
            auVar46._4_4_ = fStack_b4 + 1.0;
            auVar46._8_4_ = fStack_b0 + 1.0;
            auVar46._12_4_ = fStack_ac + 1.0;
            auVar73._0_4_ = (float)local_168._0_4_ + 1.0;
            auVar73._4_4_ = (float)local_168._4_4_ + 1.0;
            auVar73._8_4_ = fStack_160 + 1.0;
            auVar73._12_4_ = fStack_15c + 1.0;
            auVar88._0_4_ = (int)auVar82._0_4_;
            auVar88._4_4_ = (int)auVar82._4_4_;
            auVar88._8_4_ = (int)auVar82._8_4_;
            auVar88._12_4_ = (int)auVar82._12_4_;
            auVar82 = vpslld_avx(auVar88,0x17);
            auVar82 = vpaddd_avx(auVar110,auVar82);
            auVar30._0_4_ =
                 (fVar37 + 1.0 +
                 fVar37 * fVar37 *
                 (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37 +
                   0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar82._0_4_ + 1.0;
            auVar30._4_4_ =
                 (fVar39 + 1.0 +
                 fVar39 * fVar39 *
                 (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
                   0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar82._4_4_ + 1.0;
            auVar30._8_4_ =
                 (fVar41 + 1.0 +
                 fVar41 * fVar41 *
                 (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                   0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar82._8_4_ + 1.0;
            auVar30._12_4_ =
                 (fVar43 + 1.0 +
                 fVar43 * fVar43 *
                 (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                   0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar82._12_4_ + 1.0;
            auVar102._8_4_ = 0x40000000;
            auVar102._0_8_ = 0x4000000040000000;
            auVar102._12_4_ = 0x40000000;
            auVar82 = vdivps_avx(auVar102,auVar30);
            auVar31._0_4_ = auVar82._0_4_ + -1.0;
            auVar31._4_4_ = auVar82._4_4_ + -1.0;
            auVar31._8_4_ = auVar82._8_4_ + -1.0;
            auVar31._12_4_ = auVar82._12_4_ + -1.0;
            auVar82 = vdivps_avx(auVar31,auVar46);
            auVar70 = vdivps_avx(*(undefined1 (*) [16])((long)local_68 + lVar15 * 4),auVar73);
            auVar32._0_4_ = auVar82._0_4_ + auVar70._0_4_;
            auVar32._4_4_ = auVar82._4_4_ + auVar70._4_4_;
            auVar32._8_4_ = auVar82._8_4_ + auVar70._8_4_;
            auVar32._12_4_ = auVar82._12_4_ + auVar70._12_4_;
            auVar47._0_4_ = auVar32._0_4_ * -2.0;
            auVar47._4_4_ = auVar32._4_4_ * -2.0;
            auVar47._8_4_ = auVar32._8_4_ * -2.0;
            auVar47._12_4_ = auVar32._12_4_ * -2.0;
            auVar82 = vminps_avx(auVar113,auVar47);
            auVar74._8_4_ = 0xc2b0c0a5;
            auVar74._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar74._12_4_ = 0xc2b0c0a5;
            auVar28 = vmaxps_avx(auVar82,auVar74);
            auVar75._0_4_ = auVar28._0_4_ * 1.442695 + 0.5;
            auVar75._4_4_ = auVar28._4_4_ * 1.442695 + 0.5;
            auVar75._8_4_ = auVar28._8_4_ * 1.442695 + 0.5;
            auVar75._12_4_ = auVar28._12_4_ * 1.442695 + 0.5;
            auVar89._0_4_ = (int)auVar75._0_4_;
            auVar89._4_4_ = (int)auVar75._4_4_;
            auVar89._8_4_ = (int)auVar75._8_4_;
            auVar89._12_4_ = (int)auVar75._12_4_;
            auVar70 = vcvtdq2ps_avx(auVar89);
            auVar82 = vcmpps_avx(auVar75,auVar70,1);
            auVar82 = vandps_avx(auVar110,auVar82);
            auVar82 = vsubps_avx(auVar70,auVar82);
            auVar90._0_4_ = auVar82._0_4_ * 0.6931472;
            auVar90._4_4_ = auVar82._4_4_ * 0.6931472;
            auVar90._8_4_ = auVar82._8_4_ * 0.6931472;
            auVar90._12_4_ = auVar82._12_4_ * 0.6931472;
            auVar70 = vsubps_avx(auVar28,auVar90);
            fVar37 = auVar70._0_4_;
            fVar39 = auVar70._4_4_;
            fVar41 = auVar70._8_4_;
            fVar43 = auVar70._12_4_;
            auVar76._0_4_ = (int)auVar82._0_4_;
            auVar76._4_4_ = (int)auVar82._4_4_;
            auVar76._8_4_ = (int)auVar82._8_4_;
            auVar76._12_4_ = (int)auVar82._12_4_;
            auVar82 = vpslld_avx(auVar76,0x17);
            auVar82 = vpaddd_avx(auVar110,auVar82);
            auVar61._0_4_ =
                 (fVar27 + 1.0 +
                 fVar27 * fVar27 *
                 (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                   0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar48._0_4_ + 1.0;
            auVar61._4_4_ =
                 (fVar38 + 1.0 +
                 fVar38 * fVar38 *
                 (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                   0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) * auVar48._4_4_ + 1.0;
            auVar61._8_4_ =
                 (fVar40 + 1.0 +
                 fVar40 * fVar40 *
                 (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                   0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar48._8_4_ + 1.0;
            auVar61._12_4_ =
                 (fVar42 + 1.0 +
                 fVar42 * fVar42 *
                 (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) * fVar42 +
                   0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5)) * auVar48._12_4_ + 1.0;
            auVar48._0_4_ =
                 (fVar37 + 1.0 +
                 fVar37 * fVar37 *
                 (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37 +
                   0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar82._0_4_ + 1.0;
            auVar48._4_4_ =
                 (fVar39 + 1.0 +
                 fVar39 * fVar39 *
                 (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
                   0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar82._4_4_ + 1.0;
            auVar48._8_4_ =
                 (fVar41 + 1.0 +
                 fVar41 * fVar41 *
                 (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                   0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar82._8_4_ + 1.0;
            auVar48._12_4_ =
                 (fVar43 + 1.0 +
                 fVar43 * fVar43 *
                 (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                   0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar82._12_4_ + 1.0;
            auVar82 = vdivps_avx(auVar102,auVar48);
            auVar49._0_4_ = auVar82._0_4_ + -1.0;
            auVar49._4_4_ = auVar82._4_4_ + -1.0;
            auVar49._8_4_ = auVar82._8_4_ + -1.0;
            auVar49._12_4_ = auVar82._12_4_ + -1.0;
            auVar82 = vdivps_avx(auVar49,auVar61);
            *(undefined1 (*) [16])((long)local_68 + lVar15 * 4) = auVar32;
            pvVar16 = (void *)local_118._0_8_;
            if (uVar7 == _h) {
              *(undefined1 (*) [16])((long)pvVar8 + lVar15 * 4) = auVar82;
              pvVar16 = pvVar24;
            }
            *(undefined1 (*) [16])((long)pvVar16 + lVar15 * 4) = auVar82;
            lVar15 = lVar15 + 4;
          } while (local_98 != lVar15);
        }
        auVar82 = in_ZMM12._0_16_;
        local_60 = (void *)local_118._0_8_;
        local_78 = uVar20;
        if ((uint)local_130 != _h) {
          local_70 = (long)local_1b8.w * local_1b8.elemsize;
          pfVar26 = (float *)((long)local_1b8.data + local_70 * local_130 + 0xc);
          uVar20 = local_130;
          do {
            local_c8 = ZEXT416((uint)pfVar26[-2]);
            _local_168 = ZEXT416((uint)pfVar26[-1]);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            local_158._0_4_ = *pfVar26;
            local_b8 = expf(-pfVar26[-3]);
            local_b8 = local_b8 + 1.0;
            fVar27 = expf(-(float)local_c8._0_4_);
            local_c8._0_4_ = fVar27 + 1.0;
            fVar27 = expf(-(float)local_168._0_4_);
            local_168._0_4_ = fVar27;
            fVar27 = tanhf((float)local_158._0_4_);
            pvVar16 = local_68;
            local_158._0_4_ =
                 *(float *)((long)local_68 + uVar20 * 4) / (float)local_c8._0_4_ + fVar27 / local_b8
            ;
            fVar27 = tanhf((float)local_158._0_4_);
            auVar82 = in_ZMM12._0_16_;
            fVar27 = fVar27 / ((float)local_168._0_4_ + 1.0);
            *(undefined4 *)((long)pvVar16 + uVar20 * 4) = local_158._0_4_;
            pvVar16 = local_60;
            if (uVar7 == _h) {
              *(float *)((long)pvVar8 + uVar20 * 4) = fVar27;
              pvVar16 = pvVar24;
            }
            *(float *)((long)pvVar16 + uVar20 * 4) = fVar27;
            uVar20 = uVar20 + 1;
            pfVar26 = (float *)((long)pfVar26 + local_70);
          } while ((long)uVar20 < (long)uVar14);
        }
        auVar34 = _DAT_005f08a0;
        auVar78 = _DAT_005f0880;
        auVar82 = vpcmpeqd_avx(auVar82,auVar82);
        in_ZMM12 = ZEXT1664(auVar82);
        if (0 < (int)uVar7 && uVar7 != _h) {
          pvVar16 = weight_hr->data;
          iVar22 = weight_hr->w;
          sVar9 = weight_hr->elemsize;
          uVar20 = 0;
          do {
            if ((int)_h < 1) {
              uVar112 = 0;
            }
            else {
              uVar17 = 0;
              auVar79 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar36 = auVar79;
                auVar50._8_8_ = 0;
                auVar50._0_8_ = uVar17;
                auVar70 = vpshufd_avx(auVar50,0x44);
                auVar62._16_16_ = auVar70;
                auVar62._0_16_ = auVar70;
                auVar10 = vorps_avx(auVar78,auVar62);
                auVar62 = vorps_avx(auVar34,auVar62);
                auVar101._0_8_ = local_58._16_8_ ^ 0x8000000000000000;
                auVar101._8_4_ = local_58._24_4_;
                auVar101._12_4_ = local_58._28_4_ ^ 0x80000000;
                auVar91._0_8_ = auVar62._16_8_ ^ 0x8000000000000000;
                auVar91._8_4_ = auVar62._24_4_;
                auVar91._12_4_ = auVar62._28_4_ ^ 0x80000000;
                auVar48 = vpcmpgtq_avx(auVar91,auVar101);
                uVar12 = local_58._0_8_;
                auVar103._0_8_ = uVar12 ^ 0x8000000000000000;
                uVar112 = local_58._8_4_;
                auVar103._8_4_ = uVar112;
                uVar18 = local_58._12_4_;
                auVar103._12_4_ = uVar18 ^ 0x80000000;
                auVar104._0_8_ = auVar62._0_8_ ^ 0x8000000000000000;
                auVar77._8_4_ = auVar62._8_4_;
                auVar104._8_4_ = auVar77._8_4_;
                auVar104._12_4_ = auVar62._12_4_ ^ 0x80000000;
                auVar70 = vpcmpgtq_avx(auVar104,auVar103);
                auVar70 = vpackssdw_avx(auVar70,auVar48);
                auVar105._0_8_ = auVar10._16_8_ ^ 0x8000000000000000;
                auVar105._8_4_ = auVar10._24_4_;
                auVar105._12_4_ = auVar10._28_4_ ^ 0x80000000;
                auVar29 = vpcmpgtq_avx(auVar105,auVar101);
                auVar106._0_8_ = uVar12 ^ 0x8000000000000000;
                auVar106._8_4_ = uVar112;
                auVar106._12_4_ = uVar18 ^ 0x80000000;
                auVar111._0_8_ = auVar10._0_8_ ^ 0x8000000000000000;
                auVar51._8_4_ = auVar10._8_4_;
                auVar111._8_4_ = auVar51._8_4_;
                auVar111._12_4_ = auVar10._12_4_ ^ 0x80000000;
                auVar28 = vpcmpgtq_avx(auVar111,auVar106);
                auVar28 = vpackssdw_avx(auVar28,auVar29);
                auVar70 = vpackssdw_avx(auVar82 ^ auVar28,auVar82 ^ auVar70);
                auVar28 = vpmovsxwd_avx(auVar70);
                auVar70 = vpunpckhwd_avx(auVar70,auVar70);
                auVar108._16_16_ = auVar70;
                auVar108._0_16_ = auVar28;
                auVar11 = vmaskmovps_avx(auVar108,*(undefined1 (*) [32])
                                                   (local_118._0_8_ + uVar17 * 4));
                auVar108 = vmaskmovps_avx(auVar108,*(undefined1 (*) [32])
                                                    ((long)pvVar16 + uVar17 * 4));
                auVar33._0_4_ = auVar11._0_4_ * auVar108._0_4_ + auVar36._0_4_;
                auVar33._4_4_ = auVar11._4_4_ * auVar108._4_4_ + auVar36._4_4_;
                auVar33._8_4_ = auVar11._8_4_ * auVar108._8_4_ + auVar36._8_4_;
                auVar33._12_4_ = auVar11._12_4_ * auVar108._12_4_ + auVar36._12_4_;
                auVar35._16_4_ = auVar11._16_4_ * auVar108._16_4_ + auVar36._16_4_;
                auVar35._0_16_ = auVar33;
                auVar35._20_4_ = auVar11._20_4_ * auVar108._20_4_ + auVar36._20_4_;
                auVar35._24_4_ = auVar11._24_4_ * auVar108._24_4_ + auVar36._24_4_;
                auVar35._28_4_ = auVar108._28_4_ + auVar36._28_4_;
                uVar17 = uVar17 + 8;
                auVar79 = ZEXT3264(auVar35);
              } while (local_a0 != uVar17);
              auVar107._0_8_ = uVar12 ^ 0x8000000000000000;
              auVar107._8_4_ = uVar112;
              auVar107._12_4_ = uVar18 ^ 0x80000000;
              auVar77._0_8_ = auVar62._0_8_ ^ 0x8000000000000000;
              auVar77._12_4_ = auVar62._12_4_ ^ 0x80000000;
              auVar70 = vpcmpgtq_avx(auVar77,auVar107);
              auVar28 = vpackssdw_avx(auVar70,auVar48);
              auVar92._0_8_ = uVar12 ^ 0x8000000000000000;
              auVar92._8_4_ = uVar112;
              auVar92._12_4_ = uVar18 ^ 0x80000000;
              auVar51._0_8_ = auVar10._0_8_ ^ 0x8000000000000000;
              auVar51._12_4_ = auVar10._12_4_ ^ 0x80000000;
              auVar70 = vpcmpgtq_avx(auVar51,auVar92);
              auVar70 = vpackssdw_avx(auVar70,auVar29);
              auVar70 = vblendvps_avx(auVar36._0_16_,auVar33,auVar82 ^ auVar70);
              auVar28 = vblendvps_avx(auVar36._16_16_,auVar35._16_16_,auVar82 ^ auVar28);
              auVar70 = vhaddps_avx(auVar28,auVar70);
              auVar70 = vhaddps_avx(auVar70,auVar70);
              auVar70 = vhaddps_avx(auVar70,auVar70);
              uVar112 = auVar70._0_4_;
            }
            *(undefined4 *)((long)pvVar24 + uVar20 * 4) = uVar112;
            *(undefined4 *)((long)pvVar8 + uVar20 * 4) = uVar112;
            uVar20 = uVar20 + 1;
            pvVar16 = (void *)((long)pvVar16 + (long)iVar22 * sVar9);
          } while (uVar20 != uVar7);
        }
        uVar18 = (int)local_78 + 1;
        uVar20 = (ulong)uVar18;
      } while (uVar18 != uVar6);
      iVar22 = 0;
    }
  }
  else {
    Mat::create((Mat *)local_118,_h,4,opt->workspace_allocator);
    iVar22 = -100;
    if (((void *)local_118._0_8_ != (void *)0x0) && ((long)local_e0 * local_d8 != 0))
    goto LAB_003a77de;
  }
  piVar13 = (int *)CONCAT44(local_118._12_4_,local_118._8_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_f8 == (Allocator *)0x0) {
        if ((void *)local_118._0_8_ != (void *)0x0) {
          free((void *)local_118._0_8_);
        }
      }
      else {
        (*local_f8->_vptr_Allocator[3])();
      }
    }
  }
  local_d8 = 0;
  local_118._0_8_ = (void *)0x0;
  local_118._8_4_ = 0;
  local_118._12_4_ = 0;
  local_118._16_12_ = SUB1612((undefined1  [16])0x0,4);
  iStack_f0 = 0;
  iStack_ec = 0;
  uStack_e8._0_4_ = 0;
  uStack_e8._4_4_ = 0;
  local_e0 = 0;
LAB_003a8489:
  piVar13 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar22;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, const Mat& weight_hr, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;
    int hidden_size = cell_state.w;

    // 4 x hidden_size
    Mat gates(4, hidden_size, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    Mat tmp_hidden_state;
    if (num_output != hidden_size)
    {
        tmp_hidden_state.create(hidden_size, 4u, opt.workspace_allocator);
        if (tmp_hidden_state.empty())
            return -100;
    }

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

#if __AVX__
        int nn_hidden_size = hidden_size >> 1;
        int remain_hidden_size_start = nn_hidden_size << 1;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int qq = 0; qq < nn_hidden_size; qq++)
        {
            int q = qq * 2;

            const float* bias_c_IFOG = (const float*)bias_c + q * 4;

            // gate I F O G
            const float* weight_xc_IFOG = weight_xc.row(q / 2);
            const float* weight_hc_IFOG = weight_hc.row(q / 2);

            __m256 _IFOG = _mm256_loadu_ps(bias_c_IFOG);
            __m256 _sum1 = _mm256_setzero_ps();
            __m256 _sum2 = _mm256_setzero_ps();
            __m256 _sum3 = _mm256_setzero_ps();

            const float* x = bottom_blob.row(ti);

            int i = 0;
            for (; i + 3 < size; i += 4)
            {
                __m256 _xi0 = _mm256_broadcast_ss(x);
                __m256 _xi1 = _mm256_broadcast_ss(x + 1);
                __m256 _xi2 = _mm256_broadcast_ss(x + 2);
                __m256 _xi3 = _mm256_broadcast_ss(x + 3);
                __m256 _weight_xc_IFOG0 = _mm256_loadu_ps(weight_xc_IFOG);
                __m256 _weight_xc_IFOG1 = _mm256_loadu_ps(weight_xc_IFOG + 8);
                __m256 _weight_xc_IFOG2 = _mm256_loadu_ps(weight_xc_IFOG + 16);
                __m256 _weight_xc_IFOG3 = _mm256_loadu_ps(weight_xc_IFOG + 24);
                _IFOG = _mm256_comp_fmadd_ps(_weight_xc_IFOG0, _xi0, _IFOG);
                _sum1 = _mm256_comp_fmadd_ps(_weight_xc_IFOG1, _xi1, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_weight_xc_IFOG2, _xi2, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_weight_xc_IFOG3, _xi3, _sum3);

                x += 4;
                weight_xc_IFOG += 32;
            }
            for (; i < size; i++)
            {
                __m256 _xi = _mm256_broadcast_ss(x);
                __m256 _weight_xc_IFOG = _mm256_loadu_ps(weight_xc_IFOG);
                _IFOG = _mm256_comp_fmadd_ps(_weight_xc_IFOG, _xi, _IFOG);

                x += 1;
                weight_xc_IFOG += 8;
            }

            const float* hidden_ptr = hidden_state;

            i = 0;
            for (; i + 3 < num_output; i += 4)
            {
                __m256 _h_cont0 = _mm256_broadcast_ss(hidden_ptr);
                __m256 _h_cont1 = _mm256_broadcast_ss(hidden_ptr + 1);
                __m256 _h_cont2 = _mm256_broadcast_ss(hidden_ptr + 2);
                __m256 _h_cont3 = _mm256_broadcast_ss(hidden_ptr + 3);
                __m256 _weight_hc_IFOG0 = _mm256_loadu_ps(weight_hc_IFOG);
                __m256 _weight_hc_IFOG1 = _mm256_loadu_ps(weight_hc_IFOG + 8);
                __m256 _weight_hc_IFOG2 = _mm256_loadu_ps(weight_hc_IFOG + 16);
                __m256 _weight_hc_IFOG3 = _mm256_loadu_ps(weight_hc_IFOG + 24);
                _IFOG = _mm256_comp_fmadd_ps(_weight_hc_IFOG0, _h_cont0, _IFOG);
                _sum1 = _mm256_comp_fmadd_ps(_weight_hc_IFOG1, _h_cont1, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_weight_hc_IFOG2, _h_cont2, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_weight_hc_IFOG3, _h_cont3, _sum3);

                hidden_ptr += 4;
                weight_hc_IFOG += 32;
            }
            for (; i < num_output; i++)
            {
                __m256 _h_cont = _mm256_broadcast_ss(hidden_ptr);
                __m256 _weight_hc_IFOG = _mm256_loadu_ps(weight_hc_IFOG);
                _IFOG = _mm256_comp_fmadd_ps(_weight_hc_IFOG, _h_cont, _IFOG);

                hidden_ptr += 1;
                weight_hc_IFOG += 8;
            }

            float* gates_data = gates.row(q);

            _IFOG = _mm256_add_ps(_IFOG, _sum1);
            _sum2 = _mm256_add_ps(_sum2, _sum3);
            _IFOG = _mm256_add_ps(_IFOG, _sum2);

            _mm256_storeu_ps(gates_data, _IFOG);
        }
#else
        int nn_hidden_size = 0;
        int remain_hidden_size_start = 0;
#endif // __AVX__

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = remain_hidden_size_start; q < hidden_size; q++)
        {
            const float* bias_c_IFOG = (const float*)bias_c + q * 4;

            // gate I F O G
#if __AVX__
            const float* weight_xc_IFOG = weight_xc.row(q / 2 + q % 2);
            const float* weight_hc_IFOG = weight_hc.row(q / 2 + q % 2);
#else
            const float* weight_xc_IFOG = weight_xc.row(q);
            const float* weight_hc_IFOG = weight_hc.row(q);
#endif

#if __SSE2__
            __m128 _IFOG = _mm_loadu_ps(bias_c_IFOG);
            __m128 _sum1 = _mm_setzero_ps();
            __m128 _sum2 = _mm_setzero_ps();
            __m128 _sum3 = _mm_setzero_ps();
#else  // __SSE2__
            float I = bias_c_IFOG[0];
            float F = bias_c_IFOG[1];
            float O = bias_c_IFOG[2];
            float G = bias_c_IFOG[3];
#endif // __SSE2__

            const float* x = bottom_blob.row(ti);

            int i = 0;
#if __SSE2__
            for (; i + 3 < size; i += 4)
            {
                __m128 _xi0 = _mm_load1_ps(x);
                __m128 _xi1 = _mm_load1_ps(x + 1);
                __m128 _xi2 = _mm_load1_ps(x + 2);
                __m128 _xi3 = _mm_load1_ps(x + 3);
                __m128 _weight_xc_IFOG0 = _mm_loadu_ps(weight_xc_IFOG);
                __m128 _weight_xc_IFOG1 = _mm_loadu_ps(weight_xc_IFOG + 4);
                __m128 _weight_xc_IFOG2 = _mm_loadu_ps(weight_xc_IFOG + 8);
                __m128 _weight_xc_IFOG3 = _mm_loadu_ps(weight_xc_IFOG + 12);
                _IFOG = _mm_comp_fmadd_ps(_weight_xc_IFOG0, _xi0, _IFOG);
                _sum1 = _mm_comp_fmadd_ps(_weight_xc_IFOG1, _xi1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_weight_xc_IFOG2, _xi2, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_weight_xc_IFOG3, _xi3, _sum3);

                x += 4;
                weight_xc_IFOG += 16;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
#if __SSE2__
                __m128 _xi = _mm_load1_ps(x);
                __m128 _weight_xc_IFOG = _mm_loadu_ps(weight_xc_IFOG);
                _IFOG = _mm_comp_fmadd_ps(_weight_xc_IFOG, _xi, _IFOG);
#else  // __SSE2__
                float xi = x[0];
                I += xi * weight_xc_IFOG[0];
                F += xi * weight_xc_IFOG[1];
                O += xi * weight_xc_IFOG[2];
                G += xi * weight_xc_IFOG[3];
#endif // __SSE2__

                x += 1;
                weight_xc_IFOG += 4;
            }

            const float* hidden_ptr = hidden_state;

            i = 0;
#if __SSE2__
            for (; i + 3 < num_output; i += 4)
            {
                __m128 _h_cont0 = _mm_load1_ps(hidden_ptr);
                __m128 _h_cont1 = _mm_load1_ps(hidden_ptr + 1);
                __m128 _h_cont2 = _mm_load1_ps(hidden_ptr + 2);
                __m128 _h_cont3 = _mm_load1_ps(hidden_ptr + 3);
                __m128 _weight_hc_IFOG0 = _mm_loadu_ps(weight_hc_IFOG);
                __m128 _weight_hc_IFOG1 = _mm_loadu_ps(weight_hc_IFOG + 4);
                __m128 _weight_hc_IFOG2 = _mm_loadu_ps(weight_hc_IFOG + 8);
                __m128 _weight_hc_IFOG3 = _mm_loadu_ps(weight_hc_IFOG + 12);
                _IFOG = _mm_comp_fmadd_ps(_weight_hc_IFOG0, _h_cont0, _IFOG);
                _sum1 = _mm_comp_fmadd_ps(_weight_hc_IFOG1, _h_cont1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_weight_hc_IFOG2, _h_cont2, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_weight_hc_IFOG3, _h_cont3, _sum3);

                hidden_ptr += 4;
                weight_hc_IFOG += 16;
            }
#endif // __SSE2__
            for (; i < num_output; i++)
            {
#if __SSE2__
                __m128 _h_cont = _mm_load1_ps(hidden_ptr);
                __m128 _weight_hc_IFOG = _mm_loadu_ps(weight_hc_IFOG);
                _IFOG = _mm_comp_fmadd_ps(_weight_hc_IFOG, _h_cont, _IFOG);
#else  // __SSE2__
                float h_cont = hidden_ptr[0];
                I += h_cont * weight_hc_IFOG[0];
                F += h_cont * weight_hc_IFOG[1];
                O += h_cont * weight_hc_IFOG[2];
                G += h_cont * weight_hc_IFOG[3];
#endif // __SSE2__

                hidden_ptr += 1;
                weight_hc_IFOG += 4;
            }

            float* gates_data = gates.row(q);

#if __SSE2__
            _IFOG = _mm_add_ps(_IFOG, _sum1);
            _sum2 = _mm_add_ps(_sum2, _sum3);
            _IFOG = _mm_add_ps(_IFOG, _sum2);

            _mm_storeu_ps(gates_data, _IFOG);
#else  // __SSE2__
            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
#endif // __SSE2__
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);

        float* cell_ptr = cell_state;
        float* hidden_ptr = hidden_state;
        float* tmp_hidden_ptr = tmp_hidden_state;

#if __SSE2__
        nn_hidden_size = hidden_size >> 2;
        remain_hidden_size_start = nn_hidden_size << 2;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int qq = 0; qq < nn_hidden_size; qq++)
        {
            int q = qq * 4;

            const float* gates_data = gates.row(q);

            __m128 _IFOG_4x4_0 = _mm_loadu_ps(gates_data);
            __m128 _IFOG_4x4_1 = _mm_loadu_ps(gates_data + 4);
            __m128 _IFOG_4x4_2 = _mm_loadu_ps(gates_data + 8);
            __m128 _IFOG_4x4_3 = _mm_loadu_ps(gates_data + 12);

            _MM_TRANSPOSE4_PS(_IFOG_4x4_0, _IFOG_4x4_1, _IFOG_4x4_2, _IFOG_4x4_3);

            __m128 _lstm_I = sigmoid_sse(_IFOG_4x4_0);
            __m128 _lstm_F = sigmoid_sse(_IFOG_4x4_1);
            __m128 _lstm_O = sigmoid_sse(_IFOG_4x4_2);
            __m128 _lstm_G = tanh_sse(_IFOG_4x4_3);

            __m128 _cell2 = _mm_add_ps(_mm_mul_ps(_lstm_F, _mm_loadu_ps(cell_ptr + q)), _mm_mul_ps(_lstm_I, _lstm_G));
            __m128 _lstm_H = _mm_mul_ps(_lstm_O, tanh_sse(_cell2));

            _mm_storeu_ps(cell_ptr + q, _cell2);

            if (num_output == hidden_size)
            {
                _mm_storeu_ps(hidden_ptr + q, _lstm_H);
                _mm_storeu_ps(output_data + q, _lstm_H);
            }
            else
            {
                _mm_storeu_ps(tmp_hidden_ptr + q, _lstm_H);
            }
        }
#else  // __SSE2__
        remain_hidden_size_start = 0;
#endif // __SSE2__
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = remain_hidden_size_start; q < hidden_size; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + expf(-I));
            F = 1.f / (1.f + expf(-F));
            O = 1.f / (1.f + expf(-O));
            G = tanhf(G);

            float cell2 = F * cell_ptr[q] + I * G;
            float H = O * tanhf(cell2);

            cell_ptr[q] = cell2;
            if (num_output == hidden_size)
            {
                hidden_ptr[q] = H;
                output_data[q] = H;
            }
            else
            {
                tmp_hidden_ptr[q] = H;
            }
        }

        if (num_output != hidden_size)
        {
            // int nn_num_output = num_output >> 2;
            // int remain_num_output_start = nn_num_output << 2;
            // #pragma omp parallel for num_threads(opt.num_threads)
            // for (int qq = 0; qq < nn_num_output; qq++)
            // {
            //     int q = qq * 4;
            //
            // }
            int remain_num_output_start = 0;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = remain_num_output_start; q < num_output; q++)
            {
                const float* hr = weight_hr.row(q);
                const float* tmp_hidden_ptr = tmp_hidden_state;

                float H = 0;
                for (int i = 0; i < hidden_size; i++)
                {
                    H += tmp_hidden_ptr[i] * hr[i];
                }

                output_data[q] = H;
                hidden_ptr[q] = H;
            }
        }
    }

    return 0;
}